

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

CompatibleInterfacesBase * __thiscall
cmGeneratorTarget::GetCompatibleInterfaces(cmGeneratorTarget *this,string *config)

{
  cmGeneratorTarget *pcVar1;
  mapped_type *this_00;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *pvVar2;
  char *pcVar3;
  pointer ppcVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  props;
  allocator local_89;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_88;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Stack_80;
  undefined8 local_78;
  mapped_type *local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_48;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_40;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_38;
  
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::CompatibleInterfaces,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::CompatibleInterfaces>_>_>
            ::operator[](&this->CompatibleInterfacesMap,config);
  local_70 = this_00;
  if (this_00->Done == false) {
    this_00->Done = true;
    std::__cxx11::string::string
              ((string *)&local_68,"POSITION_INDEPENDENT_CODE",(allocator *)&local_88);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)this_00,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::string((string *)&local_68,"AUTOUIC_OPTIONS",(allocator *)&local_88);
    local_38 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&(this_00->super_CompatibleInterfacesBase).PropsString;
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>(local_38,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    pvVar2 = GetLinkImplementationClosure(this,config);
    local_40 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&(this_00->super_CompatibleInterfacesBase).PropsNumberMin;
    local_48 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&(this_00->super_CompatibleInterfacesBase).PropsNumberMax;
    for (ppcVar4 = (pvVar2->
                   super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        ppcVar4 !=
        (pvVar2->
        super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>).
        _M_impl.super__Vector_impl_data._M_finish; ppcVar4 = ppcVar4 + 1) {
      pcVar1 = *ppcVar4;
      std::__cxx11::string::string
                ((string *)&local_68,"COMPATIBLE_INTERFACE_BOOL",(allocator *)&local_88);
      pcVar3 = GetProperty(pcVar1,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      if (pcVar3 != (char *)0x0) {
        local_88._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        _Stack_80._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_78 = 0;
        std::__cxx11::string::string((string *)&local_68,pcVar3,&local_89);
        cmSystemTools::ExpandListArgument
                  (&local_68,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_88,false);
        std::__cxx11::string::~string((string *)&local_68);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::
        _M_insert_range_unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_70,local_88,_Stack_80);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_88);
      }
      pcVar1 = *ppcVar4;
      std::__cxx11::string::string
                ((string *)&local_68,"COMPATIBLE_INTERFACE_STRING",(allocator *)&local_88);
      pcVar3 = GetProperty(pcVar1,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      if (pcVar3 != (char *)0x0) {
        local_88._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        _Stack_80._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_78 = 0;
        std::__cxx11::string::string((string *)&local_68,pcVar3,&local_89);
        cmSystemTools::ExpandListArgument
                  (&local_68,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_88,false);
        std::__cxx11::string::~string((string *)&local_68);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::
        _M_insert_range_unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  (local_38,local_88,_Stack_80);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_88);
      }
      pcVar1 = *ppcVar4;
      std::__cxx11::string::string
                ((string *)&local_68,"COMPATIBLE_INTERFACE_NUMBER_MIN",(allocator *)&local_88);
      pcVar3 = GetProperty(pcVar1,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      if (pcVar3 != (char *)0x0) {
        local_88._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        _Stack_80._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_78 = 0;
        std::__cxx11::string::string((string *)&local_68,pcVar3,&local_89);
        cmSystemTools::ExpandListArgument
                  (&local_68,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_88,false);
        std::__cxx11::string::~string((string *)&local_68);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::
        _M_insert_range_unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  (local_40,local_88,_Stack_80);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_88);
      }
      pcVar1 = *ppcVar4;
      std::__cxx11::string::string
                ((string *)&local_68,"COMPATIBLE_INTERFACE_NUMBER_MAX",(allocator *)&local_88);
      pcVar3 = GetProperty(pcVar1,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      if (pcVar3 != (char *)0x0) {
        local_88._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        _Stack_80._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_78 = 0;
        std::__cxx11::string::string((string *)&local_68,pcVar3,&local_89);
        cmSystemTools::ExpandListArgument
                  (&local_68,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_88,false);
        std::__cxx11::string::~string((string *)&local_68);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::
        _M_insert_range_unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  (local_48,local_88,_Stack_80);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_88);
      }
    }
  }
  return &local_70->super_CompatibleInterfacesBase;
}

Assistant:

const cmGeneratorTarget::CompatibleInterfacesBase&
cmGeneratorTarget::GetCompatibleInterfaces(std::string const& config) const
{
  cmGeneratorTarget::CompatibleInterfaces& compat =
    this->CompatibleInterfacesMap[config];
  if (!compat.Done) {
    compat.Done = true;
    compat.PropsBool.insert("POSITION_INDEPENDENT_CODE");
    compat.PropsString.insert("AUTOUIC_OPTIONS");
    std::vector<cmGeneratorTarget const*> const& deps =
      this->GetLinkImplementationClosure(config);
    for (std::vector<cmGeneratorTarget const*>::const_iterator li =
           deps.begin();
         li != deps.end(); ++li) {
#define CM_READ_COMPATIBLE_INTERFACE(X, x)                                    \
  if (const char* prop = (*li)->GetProperty("COMPATIBLE_INTERFACE_" #X)) {    \
    std::vector<std::string> props;                                           \
    cmSystemTools::ExpandListArgument(prop, props);                           \
    compat.Props##x.insert(props.begin(), props.end());                       \
  }
      CM_READ_COMPATIBLE_INTERFACE(BOOL, Bool)
      CM_READ_COMPATIBLE_INTERFACE(STRING, String)
      CM_READ_COMPATIBLE_INTERFACE(NUMBER_MIN, NumberMin)
      CM_READ_COMPATIBLE_INTERFACE(NUMBER_MAX, NumberMax)
#undef CM_READ_COMPATIBLE_INTERFACE
    }
  }
  return compat;
}